

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.h
# Opt level: O0

EventMeta * rlib::midi::EventMeta::createText(Type type,string *text)

{
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __result;
  EventMeta *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff78;
  EventMeta *pEVar1;
  EventMeta *this;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa8;
  EventMeta local_30;
  
  this = &local_30;
  pEVar1 = in_RDI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x113574);
  std::__cxx11::string::begin();
  std::__cxx11::string::end();
  __result = std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       (in_stack_ffffffffffffff78);
  std::
  copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,__result);
  EventMeta(this,(Type)((ulong)pEVar1 >> 0x20),
            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  return pEVar1;
}

Assistant:

static EventMeta createText(Type type,const std::string &text) {
			// TODO: ココで type のチェックを
			std::vector<uint8_t> data;
			std::copy(text.begin(), text.end(), std::back_inserter(data));
			return EventMeta(type, std::move(data));
		}